

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[18],int,long>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],int *params_1,long *params_2)

{
  kj *local_78;
  size_t local_70;
  CappedArray<char,_14UL> local_68;
  CappedArray<char,_26UL> local_50;
  
  local_70 = strlen((char *)this);
  local_78 = this;
  _::Stringifier::operator*(&local_68,(Stringifier *)&_::STR,*(int *)*params);
  _::Stringifier::operator*(&local_50,(Stringifier *)&_::STR,*(long *)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_78,(ArrayPtr<const_char> *)&local_68,
             (CappedArray<char,_14UL> *)&local_50,(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}